

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

bool MakeAMove(Situation *situation,Movement *move,bool isbegin)

{
  byte bVar1;
  byte bVar2;
  UINT8 UVar3;
  pointer pMVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  UINT8 *pUVar11;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  
  bVar13 = move->from;
  bVar7 = situation->current_board[bVar13];
  bVar1 = move->to;
  bVar2 = situation->current_board[bVar1];
  uVar9 = (ulong)bVar2;
  uVar12 = ZobristKey ^ ZobristPlayer ^ ZobristTable[bVar7][bVar13];
  if (uVar9 != 0) {
    uVar12 = uVar12 ^ ZobristTable[bVar2][bVar1];
  }
  ZobristKey = uVar12 ^ ZobristTable[bVar7][bVar1];
  uVar12 = ZobristKeyCheck ^ ZobristPlayerCheck ^ ZobristTableCheck[bVar7][bVar13];
  if (uVar9 != 0) {
    uVar12 = uVar12 ^ ZobristTableCheck[bVar2][bVar1];
  }
  ZobristKeyCheck = uVar12 ^ ZobristTableCheck[situation->current_board[bVar13]][bVar1];
  iVar8 = PIECE_NUM_TO_TYPE[bVar7];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] -
       PiecesValue[situation->current_player][iVar8][bVar13];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] +
       PiecesValue[situation->current_player][iVar8][bVar1];
  if (uVar9 == 0) {
    situation->bit_row[bVar13 >> 4] =
         situation->bit_row[bVar13 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar13 + (uint)bVar13));
    situation->bit_col[bVar13 & 0xf] =
         situation->bit_col[bVar13 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar13 + (uint)bVar13));
    situation->bit_row[bVar1 >> 4] =
         situation->bit_row[bVar1 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar1 + (uint)bVar1));
    situation->bit_col[bVar1 & 0xf] =
         situation->bit_col[bVar1 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar1 + (uint)bVar1));
    situation->current_board[bVar13] = '\0';
    situation->current_board[move->to] = bVar7;
    situation->current_pieces[bVar7] = move->to;
  }
  else {
    bVar14 = (bVar2 & 0x10) == 0;
    situation->value[bVar14] =
         situation->value[bVar14] - PiecesValue[bVar14][PIECE_NUM_TO_TYPE[uVar9]][bVar1];
    situation->bit_row[bVar13 >> 4] =
         situation->bit_row[bVar13 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar13 + (uint)bVar13));
    situation->bit_col[bVar13 & 0xf] =
         situation->bit_col[bVar13 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar13 + (uint)bVar13));
    situation->current_board[bVar13] = '\0';
    situation->current_board[move->to] = bVar7;
    situation->current_pieces[bVar7] = move->to;
    situation->current_pieces[uVar9] = '\0';
  }
  bVar14 = true;
  if (isbegin) {
    iVar8 = Catch(situation,move);
    bVar13 = (byte)iVar8;
    move->catc = bVar13;
    move->movec = bVar7;
    bVar6 = true;
    if (bVar13 == 0) {
      iVar8 = CheckOpponent(situation);
      if (iVar8 == 0) {
        bVar6 = false;
      }
      else {
        bVar13 = (char)situation->current_player * -0x10 + 0x20;
        move->catc = bVar13;
        bVar7 = (byte)iVar8;
        move->movec = bVar7;
      }
    }
    pMVar4 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0xc;
    bVar5 = bVar6;
    if ((5 < uVar9) && (bVar13 != 0)) {
      lVar10 = (long)((int)uVar9 + -1);
      uVar9 = 0xffffffffffffffff;
      pUVar11 = &pMVar4[lVar10 + -1].movec;
      do {
        uVar9 = uVar9 + 2;
        bVar5 = bVar6;
        if ((5 < uVar9) || (bVar5 = false, pUVar11[-1] != bVar13)) break;
        bVar1 = *pUVar11;
        pUVar11 = pUVar11 + -0x18;
      } while (bVar1 == bVar7);
      bVar14 = pMVar4[lVar10].catc != '\0';
      if ((bVar5) && (pMVar4[lVar10].movec != '\0')) {
        uVar9 = 0;
        pUVar11 = &pMVar4[lVar10 + -2].movec;
        do {
          uVar9 = uVar9 + 2;
          bVar5 = true;
          if (4 < uVar9) goto LAB_00108982;
        } while ((pUVar11[-1] == pMVar4[lVar10].catc) &&
                (UVar3 = *pUVar11, pUVar11 = pUVar11 + -0x18, UVar3 == pMVar4[lVar10].movec));
        bVar14 = false;
        bVar5 = true;
      }
    }
  }
  else {
    bVar5 = true;
  }
LAB_00108982:
  std::vector<Movement,_std::allocator<Movement>_>::push_back(&situation->moves_stack,move);
  step = step + 1;
  if (((bVar14) || (!bVar5)) || (!isbegin)) {
    bVar14 = BeChecked(situation);
    situation->current_player = 1 - situation->current_player;
    if (!bVar14) {
      bVar14 = KingFacing(situation);
      return bVar14;
    }
  }
  else {
    situation->current_player = 1 - situation->current_player;
  }
  return true;
}

Assistant:

bool MakeAMove(Situation & situation,Movement & move, bool isbegin){

    int piece_id_from = situation.current_board[move.from];
    int piece_id_to = situation.current_board[move.to];

    

    // 1. 置换表更新
    // 1.1 当前局面哈希值
    ZobristKey ^= ZobristPlayer;
    ZobristKey ^= ZobristTable[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKey ^= ZobristTable[piece_id_to][move.to];
    ZobristKey ^= ZobristTable[piece_id_from][move.to];

    //  1.2 当前局面哈希校验值
    ZobristKeyCheck ^= ZobristPlayerCheck;
    ZobristKeyCheck ^= ZobristTableCheck[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKeyCheck ^= ZobristTableCheck[piece_id_to][move.to];
    ZobristKeyCheck ^= ZobristTableCheck[situation.current_board[move.from]][move.to];

    // 2. 更新子力价值
    situation.value[situation.current_player] -= PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.from];
    situation.value[situation.current_player] += PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.to];

    // 3. 移动棋子
    // 4.1 如果是吃子着法
    if(piece_id_to != 0){
        // 4.1.1 更新子力价值
        situation.value[ColorOfPiece(piece_id_to)] -= PiecesValue[ColorOfPiece(piece_id_to)][PIECE_NUM_TO_TYPE[piece_id_to]][move.to];
        // 4.1.2 只更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
        situation.current_pieces[piece_id_to] = 0;
    }else{
        // 4.1.1 更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.2 更新目标格的位行位列
        row = GetRow(move.to), col = GetCol(move.to);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.to];
        situation.bit_col[col] ^= BIT_COL_MASK[move.to];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
    
    }

    // 4. 如果是开始转换局面或者试探局面，则需要判断该着法是否抓子，抓的是哪个子
    int longcatme = 1, longcatopp = 1;
    if(isbegin){
        move.catc = Catch(situation, move);
        move.movec = piece_id_from;
        if(move.catc == 0){
            int check = CheckOpponent(situation);
            if(check){
                move.catc = GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0;
                move.movec = check;
            }else longcatme = 0;
        }
        // 判断自己是否已经走了6步同一子a捉同一子b
        if(situation.moves_stack.size() >= 6 && move.catc){
            int last_index = situation.moves_stack.size() - 1;
            for(int i = 1; i <= 5; i += 2){
                if(!(situation.moves_stack[last_index - i].catc == move.catc && situation.moves_stack[last_index - i].movec == move.movec)){
                    longcatme = 0;
                    break;
                }
            }
            // 如果自己长抓，判断对方是否也长抓
            int movec = situation.moves_stack[last_index].movec;
            int catc = situation.moves_stack[last_index].catc;
            if(catc == 0) longcatopp = 0;
            if(longcatme && movec){
                for(int i = 2; i <= 4; i += 2){
                    if(!(situation.moves_stack[last_index - i].catc == catc && situation.moves_stack[last_index - i].movec == movec)){
                        longcatopp = 0;
                        break;
                    }
                }
            }
        }
    }

    // 5. 放入走法栈
    situation.moves_stack.push_back(move);
    step++;

    // 自己长抓，对方没长抓，则返回true
    if(isbegin && longcatme && !longcatopp){
        ChangePlayer(situation.current_player);
        return true;
    }

    // 6. 交换走棋方
    if(BeChecked(situation)){
        ChangePlayer(situation.current_player);
        return true;
    }
    ChangePlayer(situation.current_player);
    return KingFacing(situation);
}